

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_binary_expr.hpp
# Opt level: O0

ostream * viennamath::operator<<
                    (ostream *stream,
                    ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>_>
                    *other)

{
  ostream *poVar1;
  char *this;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>_>
  *this_00;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>
  local_5a [4];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>_>
  local_40 [3];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>
  local_1c;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>_>
  *local_18;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>_>
  *other_local;
  ostream *stream_local;
  
  this = "[";
  local_18 = other;
  other_local = (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>_>
                 *)stream;
  poVar1 = std::operator<<(stream,"[");
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>_>
  ::lhs(&local_18->lhs_,
        (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>_>
         *)this);
  poVar1 = operator<<(poVar1,&local_1c);
  this_00 = local_40;
  op_minus<double>::str_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,(string *)this_00);
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>_>
  ::rhs((internal_rhs_type *)local_18,this_00);
  poVar1 = operator<<(poVar1,local_5a);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string((string *)local_40);
  return (ostream *)other_local;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, ct_binary_expr<LHS, OP, RHS> const & other)
  {
    stream << "[" << other.lhs() << OP().str() << other.rhs() << "]";
    return stream;
  }